

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pc-identifiers.c
# Opt level: O2

FUNCTION_RETURN generate_user_pc_signature(char *identifier_out,IDENTIFICATION_STRATEGY strategy)

{
  FUNCTION_RETURN FVar1;
  PcIdentifier *identifiers;
  ulong uVar2;
  unsigned_long _zzq_result;
  uint req_buffer_size;
  char *identifier_out_local;
  unsigned_long _zzq_args [6];
  
  req_buffer_size = 0;
  identifier_out_local = identifier_out;
  FVar1 = generate_pc_id((PcIdentifier *)0x0,&req_buffer_size,strategy);
  if (FVar1 == FUNC_RET_OK) {
    if (req_buffer_size == 0) {
      FVar1 = FUNC_RET_ERROR;
    }
    else {
      uVar2 = 2;
      if (2 < req_buffer_size) {
        uVar2 = (ulong)req_buffer_size;
      }
      req_buffer_size = (uint)uVar2;
      identifiers = (PcIdentifier *)calloc(1,uVar2 * 6);
      FVar1 = generate_pc_id(identifiers,&req_buffer_size,strategy);
      if (FVar1 == FUNC_RET_OK) {
        _zzq_args[0] = 0x4d430005;
        _zzq_args[1] = (unsigned_long)(identifiers + 1);
        _zzq_args[2] = 6;
        _zzq_args[3] = 0;
        _zzq_args[4] = 0;
        _zzq_args[5] = 0;
        FVar1 = encode_pc_id((uchar *)identifiers,(uchar *)_zzq_args[1],identifier_out);
        _zzq_args[0] = 0x4d430005;
        _zzq_args[1] = (unsigned_long)&identifier_out_local;
        _zzq_args[2] = 8;
        _zzq_args[3] = 0;
        _zzq_args[4] = 0;
        _zzq_args[5] = 0;
      }
      free(identifiers);
    }
  }
  return FVar1;
}

Assistant:

FUNCTION_RETURN generate_user_pc_signature(PcSignature identifier_out,
		IDENTIFICATION_STRATEGY strategy) {
	FUNCTION_RETURN result;
	PcIdentifier* identifiers;
	unsigned int req_buffer_size = 0;
	result = generate_pc_id(NULL, &req_buffer_size, strategy);
	if (result != FUNC_RET_OK) {
		return result;
	}
	if (req_buffer_size == 0) {
		return FUNC_RET_ERROR;
	}
	req_buffer_size = req_buffer_size < 2 ? 2 : req_buffer_size;
	identifiers = (PcIdentifier *) malloc(
			sizeof(PcIdentifier) * req_buffer_size);
	memset(identifiers, 0, sizeof(PcIdentifier) * req_buffer_size);
	result = generate_pc_id(identifiers, &req_buffer_size, strategy);
	if (result != FUNC_RET_OK) {
		free(identifiers);
		return result;
	}
#ifdef __linux__
	VALGRIND_CHECK_VALUE_IS_DEFINED(identifiers[0]);
	VALGRIND_CHECK_VALUE_IS_DEFINED(identifiers[1]);
#endif
	result = encode_pc_id(identifiers[0], identifiers[1], identifier_out);
#ifdef __linux__
	VALGRIND_CHECK_VALUE_IS_DEFINED(identifier_out);
#endif
	free(identifiers);
	return result;
}